

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::WaitOrderStatementSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,WaitOrderStatementSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  ActionBlockSyntax *node;
  SyntaxNode *local_80;
  SyntaxNode *local_70;
  size_t index_local;
  WaitOrderStatementSyntax *this_local;
  
  switch(index) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              (__return_storage_ptr__,&((this->super_StatementSyntax).label)->super_SyntaxNode);
    break;
  case 1:
    local_70 = (SyntaxNode *)0x0;
    if (this != (WaitOrderStatementSyntax *)0xffffffffffffffe8) {
      local_70 = &(this->super_StatementSyntax).attributes.super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_70);
    break;
  case 2:
    token.kind = (this->wait_order).kind;
    token._2_1_ = (this->wait_order).field_0x2;
    token.numFlags.raw = (this->wait_order).numFlags.raw;
    token.rawLen = (this->wait_order).rawLen;
    token.info = (this->wait_order).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 3:
    token_00.kind = (this->openParen).kind;
    token_00._2_1_ = (this->openParen).field_0x2;
    token_00.numFlags.raw = (this->openParen).numFlags.raw;
    token_00.rawLen = (this->openParen).rawLen;
    token_00.info = (this->openParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 4:
    local_80 = (SyntaxNode *)0x0;
    if (this != (WaitOrderStatementSyntax *)0xffffffffffffff98) {
      local_80 = &(this->names).super_SyntaxListBase.super_SyntaxNode;
    }
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,local_80);
    break;
  case 5:
    token_01.kind = (this->closeParen).kind;
    token_01._2_1_ = (this->closeParen).field_0x2;
    token_01.numFlags.raw = (this->closeParen).numFlags.raw;
    token_01.rawLen = (this->closeParen).rawLen;
    token_01.info = (this->closeParen).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 6:
    node = not_null<slang::syntax::ActionBlockSyntax_*>::get(&this->action);
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,&node->super_SyntaxNode);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax WaitOrderStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return wait_order;
        case 3: return openParen;
        case 4: return &names;
        case 5: return closeParen;
        case 6: return action.get();
        default: return nullptr;
    }
}